

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::Seal
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance)

{
  int *piVar1;
  byte bVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar6;
  undefined8 extraout_RDX;
  
  bVar2 = (this->super_DynamicTypeHandler).flags;
  if ((bVar2 & 0x40) != 0) {
    return 1;
  }
  if ((bVar2 & 4) == 0) {
    bVar3 = DynamicObject::HasObjectArray(instance);
    if (!bVar3) {
      BVar5 = SealInternal(this,instance);
      return BVar5;
    }
  }
  pDVar6 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
           ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>,Js::PropertyRecord_const*>
                     ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *)
                      this,instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->
            convertSimpleDictionaryToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (pDVar6->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x37];
  iVar4 = (*UNRECOVERED_JUMPTABLE)(pDVar6,instance,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return iVar4;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::Seal(DynamicObject* instance)
    {
        if (IsNotExtensibleSupported)
        {
            if (this->GetFlags() & IsSealedOnceFlag)
            {
                // Already sealed => no further change needed.
                return TRUE;
            }

            if (!GetIsLocked() && !instance->HasObjectArray())
            {
                // If there is object array, we need to convert both type handler and array to ES5.
                // Otherwise, if the type is not shared with others, we can just change it by itself.
                return this->SealInternal(instance);
            }
        }

        return ConvertToDictionaryType(instance)->Seal(instance);
    }